

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

void icu_63::number::impl::blueprint_helpers::parseDigitsStem
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  FractionSignificantSettings FVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  int index;
  Precision local_48;
  
  iVar3 = numparse::impl::StringSegment::length(segment);
  index = 0;
  if (0 < iVar3) {
    do {
      cVar2 = numparse::impl::StringSegment::charAt(segment,index);
      if (cVar2 != L'@') break;
      index = index + 1;
      iVar3 = numparse::impl::StringSegment::length(segment);
    } while (index < iVar3);
  }
  iVar4 = numparse::impl::StringSegment::length(segment);
  iVar3 = index;
  if (index < iVar4) {
    cVar2 = numparse::impl::StringSegment::charAt(segment,index);
    if (cVar2 == L'+') {
      iVar3 = numparse::impl::StringSegment::length(segment);
      if (index + 1 < iVar3) goto LAB_0026bed9;
      Precision::minSignificantDigits(&local_48,index);
      goto LAB_0026bef2;
    }
    iVar4 = numparse::impl::StringSegment::length(segment);
    if (index < iVar4) {
      do {
        cVar2 = numparse::impl::StringSegment::charAt(segment,iVar3);
        if (cVar2 != L'#') break;
        iVar3 = iVar3 + 1;
        iVar4 = numparse::impl::StringSegment::length(segment);
      } while (iVar3 < iVar4);
    }
  }
  iVar4 = numparse::impl::StringSegment::length(segment);
  if (iVar3 < iVar4) {
LAB_0026bed9:
    *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
    return;
  }
  Precision::minMaxSignificantDigits(index,iVar3);
LAB_0026bef2:
  FVar1.fMinSig = local_48.fUnion.fracSig.fMinSig;
  FVar1.fMaxSig = local_48.fUnion.fracSig.fMaxSig;
  FVar1.fMinFrac = local_48.fUnion.fracSig.fMinFrac;
  FVar1.fMaxFrac = local_48.fUnion.fracSig.fMaxFrac;
  *(ulong *)((long)&(macros->precision).fUnion.increment.fIncrement + 4) =
       CONCAT44(local_48.fUnion._8_4_,local_48.fUnion._4_4_);
  *(undefined8 *)((long)&(macros->precision).fUnion + 0xc) = local_48._20_8_;
  (macros->precision).fType = local_48.fType;
  *(undefined4 *)&(macros->precision).field_0x4 = local_48._4_4_;
  (macros->precision).fUnion.fracSig = FVar1;
  return;
}

Assistant:

void
blueprint_helpers::parseDigitsStem(const StringSegment& segment, MacroProps& macros, UErrorCode& status) {
    U_ASSERT(segment.charAt(0) == u'@');
    int offset = 0;
    int minSig = 0;
    int maxSig;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'@') {
            minSig++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        if (segment.charAt(offset) == u'+') {
            maxSig = -1;
            offset++;
        } else {
            maxSig = minSig;
            for (; offset < segment.length(); offset++) {
                if (segment.charAt(offset) == u'#') {
                    maxSig++;
                } else {
                    break;
                }
            }
        }
    } else {
        maxSig = minSig;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid significant digits stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Use the public APIs to enforce bounds checking
    if (maxSig == -1) {
        macros.precision = Precision::minSignificantDigits(minSig);
    } else {
        macros.precision = Precision::minMaxSignificantDigits(minSig, maxSig);
    }
}